

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O3

EverCrypt_Hash_Incremental_state_t *
EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)

{
  uint *puVar1;
  undefined8 uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  uint8_t *puVar6;
  EverCrypt_Hash_state_s *pEVar7;
  EverCrypt_Hash_Incremental_state_t *pEVar8;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_00;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_01;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_02;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_03;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_04;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_05;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_06;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_07;
  EverCrypt_Hash_Incremental_state_t *extraout_RAX_08;
  undefined4 extraout_var;
  byte bVar9;
  Lib_IntVector_Intrinsics_vec256 *palVar10;
  undefined7 in_register_00000039;
  undefined8 *__nmemb;
  
  block_len(a);
  uVar4 = block_len(a);
  __nmemb = (undefined8 *)(ulong)uVar4;
  palVar10 = (Lib_IntVector_Intrinsics_vec256 *)0x1;
  puVar6 = (uint8_t *)calloc((size_t)__nmemb,1);
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    bVar9 = 2;
    break;
  case 1:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    bVar9 = 3;
    break;
  case 2:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    bVar9 = 4;
    break;
  case 3:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    bVar9 = 5;
    break;
  case 4:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(5,4);
    bVar9 = 1;
    break;
  case 5:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(4,4);
    bVar9 = 0;
    break;
  case 6:
    _Var3 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var3) {
      bVar9 = 0xb;
      palVar10 = (Lib_IntVector_Intrinsics_vec256 *)Hacl_Hash_Blake2s_Simd128_malloc_with_key();
    }
    else {
      palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,4);
      bVar9 = 10;
    }
    break;
  case 7:
    _Var3 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var3) {
      bVar9 = 0xd;
      palVar10 = Hacl_Hash_Blake2b_Simd256_malloc_with_key();
    }
    else {
      palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,8);
      bVar9 = 0xc;
    }
    break;
  case 8:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar9 = 7;
    break;
  case 9:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar9 = 6;
    break;
  case 10:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar9 = 8;
    break;
  case 0xb:
    palVar10 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    bVar9 = 9;
    break;
  default:
    EverCrypt_Hash_Incremental_malloc_cold_1();
    if (0xd < (byte)__nmemb) {
      block_len_cold_1();
      switch((ulong)__nmemb & 0xff) {
      case 0:
        Hacl_Hash_MD5_init((uint32_t *)palVar10);
        return extraout_RAX_04;
      case 1:
        Hacl_Hash_SHA1_init((uint32_t *)palVar10);
        return extraout_RAX_05;
      case 2:
        Hacl_Hash_SHA2_sha224_init((uint32_t *)palVar10);
        return extraout_RAX_02;
      case 3:
        Hacl_Hash_SHA2_sha256_init((uint32_t *)palVar10);
        return extraout_RAX_03;
      case 4:
        Hacl_Hash_SHA2_sha384_init((uint64_t *)palVar10);
        return extraout_RAX_00;
      case 5:
        Hacl_Hash_SHA2_sha512_init((uint64_t *)palVar10);
        return extraout_RAX_06;
      case 6:
      case 7:
      case 8:
      case 9:
        pEVar8 = (EverCrypt_Hash_Incremental_state_t *)memset(palVar10,0,200);
        return pEVar8;
      case 10:
        Hacl_Hash_Blake2s_init((uint32_t *)palVar10,0,0x20);
        return extraout_RAX_08;
      case 0xb:
        Hacl_Hash_Blake2s_Simd128_init((Lib_IntVector_Intrinsics_vec128 *)palVar10,0,0x20);
        return extraout_RAX;
      case 0xc:
        Hacl_Hash_Blake2b_init((uint64_t *)palVar10,0,0x40);
        return extraout_RAX_01;
      case 0xd:
        Hacl_Hash_Blake2b_Simd256_init(palVar10,0,0x40);
        return extraout_RAX_07;
      default:
        init_cold_1();
        puVar1 = (uint *)*__nmemb;
        uVar2 = __nmemb[1];
        alg_of_state((EverCrypt_Hash_state_s *)(ulong)*puVar1);
        iVar5 = init((EVP_PKEY_CTX *)(ulong)*puVar1);
        *__nmemb = puVar1;
        __nmemb[1] = uVar2;
        __nmemb[2] = 0;
        return (EverCrypt_Hash_Incremental_state_t *)CONCAT44(extraout_var,iVar5);
      }
    }
    return (EverCrypt_Hash_Incremental_state_t *)
           (ulong)*(uint *)(&DAT_001dc620 + ((ulong)__nmemb & 0xff) * 4);
  }
  pEVar7 = (EverCrypt_Hash_state_s *)malloc(0x10);
  pEVar7->tag = bVar9;
  (pEVar7->field_1).case_MD5_s = (uint32_t *)palVar10;
  pEVar8 = (EverCrypt_Hash_Incremental_state_t *)malloc(0x18);
  pEVar8->block_state = pEVar7;
  pEVar8->buf = puVar6;
  pEVar8->total_len = 0;
  init((EVP_PKEY_CTX *)(ulong)bVar9);
  return pEVar8;
}

Assistant:

EverCrypt_Hash_Incremental_state_t
*EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)
{
  KRML_CHECK_SIZE(sizeof (uint8_t), block_len(a));
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(block_len(a), sizeof (uint8_t));
  EverCrypt_Hash_state_s *block_state = create_in(a);
  EverCrypt_Hash_Incremental_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  EverCrypt_Hash_Incremental_state_t
  *p =
    (EverCrypt_Hash_Incremental_state_t *)KRML_HOST_MALLOC(sizeof (
        EverCrypt_Hash_Incremental_state_t
      ));
  p[0U] = s;
  init(block_state);
  return p;
}